

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O0

int run_test_tcp_open_twice(void)

{
  uv_os_sock_t sock;
  uv_os_sock_t sock_00;
  int iVar1;
  uv_loop_t *puVar2;
  int r;
  uv_os_sock_t sock2;
  uv_os_sock_t sock1;
  uv_tcp_t client;
  
  startup();
  sock = create_tcp_socket();
  sock_00 = create_tcp_socket();
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,(uv_tcp_t *)&sock2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x126,"r == 0");
    abort();
  }
  iVar1 = uv_tcp_open((uv_tcp_t *)&sock2,sock);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x129,"r == 0");
    abort();
  }
  iVar1 = uv_tcp_open((uv_tcp_t *)&sock2,sock_00);
  if (iVar1 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,300,"r == UV_EBUSY");
    abort();
  }
  close_socket(sock_00);
  uv_close((uv_handle_t *)&sock2,(uv_close_cb)0x0);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0x132,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(tcp_open_twice) {
  uv_tcp_t client;
  uv_os_sock_t sock1, sock2;
  int r;

  startup();
  sock1 = create_tcp_socket();
  sock2 = create_tcp_socket();

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_tcp_open(&client, sock1);
  ASSERT(r == 0);

  r = uv_tcp_open(&client, sock2);
  ASSERT(r == UV_EBUSY);
  close_socket(sock2);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}